

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O2

REF_STATUS ref_split_edge(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node)

{
  REF_INT RVar1;
  int iVar2;
  REF_CELL pRVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  char *pcVar9;
  REF_INT ncell;
  REF_INT new_cell;
  long local_258;
  REF_GRID local_250;
  REF_INT nodes [27];
  REF_INT cell_to_split [100];
  
  pRVar3 = ref_grid->cell[8];
  uVar4 = ref_cell_list_with2(pRVar3,node0,node1,100,&ncell,cell_to_split);
  if (uVar4 == 7) {
    return 7;
  }
  if (uVar4 == 0) {
    lVar7 = 0;
    local_250 = ref_grid;
    do {
      if (ncell <= lVar7) {
        pRVar3 = local_250->cell[3];
        uVar4 = ref_cell_list_with2(pRVar3,node0,node1,100,&ncell,cell_to_split);
        if (uVar4 == 0) {
          lVar7 = 0;
          goto LAB_001bbe56;
        }
        pcVar9 = "get tri list, should have been smaller then tets";
        uVar8 = 0x1ac;
        goto LAB_001bbd6a;
      }
      RVar1 = cell_to_split[lVar7];
      local_258 = lVar7;
      uVar4 = ref_cell_nodes(pRVar3,RVar1,nodes);
      if (uVar4 != 0) {
        pcVar9 = "cell nodes";
        uVar8 = 0x19b;
        goto LAB_001bbd6a;
      }
      uVar4 = ref_cell_remove(pRVar3,RVar1);
      if (uVar4 != 0) {
        pcVar9 = "remove";
        uVar8 = 0x19c;
        goto LAB_001bbd6a;
      }
      iVar2 = pRVar3->node_per;
      for (lVar7 = 0; lVar7 < iVar2; lVar7 = lVar7 + 1) {
        if (nodes[lVar7] == node0) {
          nodes[lVar7] = new_node;
        }
      }
      uVar4 = ref_cell_add(pRVar3,nodes,&new_cell);
      if (uVar4 != 0) {
        pcVar9 = "add node0 version";
        uVar8 = 0x1a0;
        goto LAB_001bbd6a;
      }
      iVar2 = pRVar3->node_per;
      for (lVar7 = 0; lVar7 < iVar2; lVar7 = lVar7 + 1) {
        if (nodes[lVar7] == new_node) {
          nodes[lVar7] = node0;
        }
      }
      for (lVar7 = 0; lVar7 < iVar2; lVar7 = lVar7 + 1) {
        if (nodes[lVar7] == node1) {
          nodes[lVar7] = new_node;
        }
      }
      uVar4 = ref_cell_add(pRVar3,nodes,&new_cell);
      lVar7 = local_258 + 1;
    } while (uVar4 == 0);
    pcVar9 = "add node1 version";
    uVar8 = 0x1a6;
  }
  else {
    pcVar9 = "tet list to split";
    uVar8 = 0x197;
  }
  goto LAB_001bbd6a;
  while( true ) {
    for (lVar6 = 0; lVar6 < pRVar3->node_per; lVar6 = lVar6 + 1) {
      if (nodes[lVar6] == node0) {
        nodes[lVar6] = new_node;
      }
    }
    uVar4 = ref_cell_add(pRVar3,nodes,&new_cell);
    if (uVar4 != 0) {
      pcVar9 = "add node0 version";
      uVar8 = 0x1ca;
      goto LAB_001bc197;
    }
    for (lVar6 = 0; uVar5 = (ulong)pRVar3->node_per, lVar6 < (long)uVar5; lVar6 = lVar6 + 1) {
      if (nodes[lVar6] == new_node) {
        nodes[lVar6] = node0;
      }
    }
    for (lVar6 = 0; lVar6 < (int)uVar5; lVar6 = lVar6 + 1) {
      if (nodes[lVar6] == node1) {
        nodes[lVar6] = new_node;
        uVar5 = (ulong)(uint)pRVar3->node_per;
      }
    }
    uVar4 = ref_cell_add(pRVar3,nodes,&new_cell);
    lVar7 = lVar7 + 1;
    if (uVar4 != 0) break;
LAB_001bc015:
    if (ncell <= lVar7) {
      return 0;
    }
    RVar1 = cell_to_split[lVar7];
    uVar4 = ref_cell_nodes(pRVar3,RVar1,nodes);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x1c5
             ,"ref_split_edge",(ulong)uVar4,"cell nodes");
      return uVar4;
    }
    uVar4 = ref_cell_remove(pRVar3,RVar1);
    if (uVar4 != 0) {
      pcVar9 = "remove";
      uVar8 = 0x1c6;
      goto LAB_001bc197;
    }
  }
  pcVar9 = "add node1 version";
  uVar8 = 0x1d0;
LAB_001bc197:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",uVar8,
         "ref_split_edge",(ulong)uVar4,pcVar9);
  return uVar4;
  while( true ) {
    RVar1 = cell_to_split[lVar7];
    local_258 = lVar7;
    uVar4 = ref_cell_nodes(pRVar3,RVar1,nodes);
    if (uVar4 != 0) {
      pcVar9 = "cell nodes";
      uVar8 = 0x1b0;
      goto LAB_001bbd6a;
    }
    uVar4 = ref_cell_remove(pRVar3,RVar1);
    if (uVar4 != 0) {
      pcVar9 = "remove";
      uVar8 = 0x1b1;
      goto LAB_001bbd6a;
    }
    for (lVar7 = 0; lVar7 < pRVar3->node_per; lVar7 = lVar7 + 1) {
      if (nodes[lVar7] == node0) {
        nodes[lVar7] = new_node;
      }
    }
    uVar4 = ref_cell_add(pRVar3,nodes,&new_cell);
    if (uVar4 != 0) {
      pcVar9 = "add node0 version";
      uVar8 = 0x1b5;
      goto LAB_001bbd6a;
    }
    for (lVar7 = 0; uVar5 = (ulong)pRVar3->node_per, lVar7 < (long)uVar5; lVar7 = lVar7 + 1) {
      if (nodes[lVar7] == new_node) {
        nodes[lVar7] = node0;
      }
    }
    for (lVar7 = 0; lVar7 < (int)uVar5; lVar7 = lVar7 + 1) {
      if (nodes[lVar7] == node1) {
        nodes[lVar7] = new_node;
        uVar5 = (ulong)(uint)pRVar3->node_per;
      }
    }
    uVar4 = ref_cell_add(pRVar3,nodes,&new_cell);
    lVar7 = local_258 + 1;
    if (uVar4 != 0) break;
LAB_001bbe56:
    if (ncell <= lVar7) {
      pRVar3 = local_250->cell[0];
      uVar4 = ref_cell_list_with2(pRVar3,node0,node1,100,&ncell,cell_to_split);
      if (uVar4 == 0) {
        lVar7 = 0;
        goto LAB_001bc015;
      }
      pcVar9 = "get edg list, should have been smaller then tets";
      uVar8 = 0x1c1;
      goto LAB_001bbd6a;
    }
  }
  pcVar9 = "add node1 version";
  uVar8 = 0x1bb;
LAB_001bbd6a:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",uVar8,
         "ref_split_edge",(ulong)uVar4,pcVar9);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge(REF_GRID ref_grid, REF_INT node0,
                                  REF_INT node1, REF_INT new_node) {
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ncell, cell_in_list;
  REF_INT cell_to_split[MAX_CELL_SPLIT];
  REF_INT node, new_cell;
  REF_STATUS status;

  ref_cell = ref_grid_tet(ref_grid);
  status = ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_SPLIT, &ncell,
                               cell_to_split);
  if (REF_INCREASE_LIMIT == status) return status;
  RSS(status, "tet list to split");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_split[cell_in_list];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
  }

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_SPLIT, &ncell,
                          cell_to_split),
      "get tri list, should have been smaller then tets");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_split[cell_in_list];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
  }

  ref_cell = ref_grid_edg(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_SPLIT, &ncell,
                          cell_to_split),
      "get edg list, should have been smaller then tets");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_split[cell_in_list];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
  }

  return REF_SUCCESS;
}